

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O2

void __thiscall
Transaction_SetUnlockingScript_Test::Transaction_SetUnlockingScript_Test
          (Transaction_SetUnlockingScript_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_006f84b8;
  return;
}

Assistant:

TEST(Transaction, SetUnlockingScript) {
  Transaction tx(exp_version, exp_locktime);
  EXPECT_NO_THROW(
      tx.AddTxIn(
          Txid(
              "d4470b3c4b616042e5004b1ab60cb1734d21b8e1c4854c379ec8c3f7ca1e450f"),
          0, 4294967294));
  EXPECT_NO_THROW(
      tx.AddTxIn(
          Txid(
              "26e04e16773d52088681d47cd6134e7de0cac124b01cf6cf76f6cfd4dc0c8758"),
          0, 4294967294));

  Script script("160014703e50206e4d27ad1340a7b6a0d94563a3fb768a");
  EXPECT_NO_THROW(tx.SetUnlockingScript(0, script));
  EXPECT_STREQ(tx.GetTxIn(0).GetUnlockingScript().GetHex().c_str(),
               "160014703e50206e4d27ad1340a7b6a0d94563a3fb768a");

  std::vector<ByteData> bytedatas;
  bytedatas.push_back(
      ByteData(
          "304402205a2f94921f645669b2b4e073da43e6a5d32335b50207f9d27f0e8a8c0a24e75902205dea52d27ad747f2df786e0ad737595cf9c5a489143170668399764a5b4be44a01"));
  bytedatas.push_back(
      ByteData(
          "0229e026bab56c1c41d16e67f084362aef204b5b7ea08dafc2fb2e0db89d9c9551"));
  EXPECT_NO_THROW(tx.SetUnlockingScript(1, bytedatas));
  EXPECT_STREQ(
      tx.GetTxIn(1).GetUnlockingScript().GetHex().c_str(),
      "47304402205a2f94921f645669b2b4e073da43e6a5d32335b50207f9d27f0e8a8c0a24e75902205dea52d27ad747f2df786e0ad737595cf9c5a489143170668399764a5b4be44a01210229e026bab56c1c41d16e67f084362aef204b5b7ea08dafc2fb2e0db89d9c9551");

  EXPECT_THROW(tx.SetUnlockingScript(3, bytedatas), CfdException);
}